

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>::
Data(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
     *this,Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
           *other)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  Mapping *pMVar9;
  Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *pNVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  long in_FS_OFFSET;
  R_conflict7 RVar14;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar12 = other->numBuckets;
  sVar13 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar13;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar12);
  this->spans = (Span *)RVar14.spans;
  lVar11 = 0;
  for (sVar12 = 0; sVar12 != RVar14.nSpans; sVar12 = sVar12 + 1) {
    pSVar4 = other->spans;
    for (sVar13 = 0; sVar13 != 0x80; sVar13 = sVar13 + 1) {
      bVar3 = pSVar4->offsets[sVar13 + lVar11];
      if (bVar3 != 0xff) {
        pEVar5 = pSVar4[sVar12].entries;
        local_48.span = this->spans + sVar12;
        local_48.index = sVar13;
        pNVar10 = Bucket::insert(&local_48);
        pEVar1 = pEVar5 + bVar3;
        uVar6 = *(undefined8 *)(pEVar1->storage).data;
        qVar7 = *(quintptr *)((pEVar1->storage).data + 8);
        puVar2 = pEVar5[bVar3].storage.data + 0x10;
        pQVar8 = *(QAbstractItemModel **)puVar2;
        pMVar9 = *(Mapping **)(puVar2 + 8);
        (pNVar10->key).index.r = (int)uVar6;
        (pNVar10->key).index.c = (int)((ulong)uVar6 >> 0x20);
        (pNVar10->key).index.i = qVar7;
        (pNVar10->key).index.m.ptr = pQVar8;
        pNVar10->value = pMVar9;
      }
    }
    lVar11 = lVar11 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }